

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall kratos::IRVisitor::visit_generator_root_p(IRVisitor *this,Generator *generator)

{
  pointer *pptVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer ptVar4;
  pointer ppVar5;
  pointer ppGVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  ulong uVar10;
  priority_task *ppVar11;
  pointer ppVar12;
  runtime_error *this_00;
  ulong uVar13;
  undefined1 auVar14 [8];
  future<void> *t_1;
  ulong uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  ulong __n;
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  undefined1 local_200 [8];
  GeneratorGraph graph;
  thread_pool pool;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  levels;
  undefined1 local_a8 [8];
  future<void> t;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  undefined1 local_78 [8];
  value_type current_level;
  Generator *local_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)local_200,generator);
  GeneratorGraph::get_leveled_nodes
            ((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
              *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
             (GeneratorGraph *)local_200);
  uVar7 = get_num_cpus();
  cxxpool::thread_pool::thread_pool((thread_pool *)&graph.root_,(ulong)uVar7);
  uVar8 = (int)((ulong)((long)levels.
                              super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start -
                       pool.thread_mutex_.super___mutex_base._M_mutex._32_8_) >> 3) * -0x55555555 -
          1;
  if (-1 < (int)uVar8) {
    uVar15 = (ulong)uVar8;
    do {
      this->level = (uint32_t)uVar15;
      cxxpool::thread_pool::clear((thread_pool *)&graph.root_);
      std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
                ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)local_78,
                 (vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                 (uVar15 * 0x18 +
                 (long)pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next));
      t.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (long)current_level.
                       super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_78 >> 3);
      ppGVar6 = current_level.
                super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (auVar14 = local_78;
          tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var3,
          p_Var16 = t.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi, auVar14 != (undefined1  [8])ppGVar6;
          auVar14 = (undefined1  [8])((long)auVar14 + 8)) {
        tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        current_level.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        local_40->_M_use_count = 1;
        local_40->_M_weak_count = 1;
        local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002adf88;
        p_Var16 = local_40 + 1;
        std::
        __create_task_state<void(),std::_Bind<kratos::IRVisitor::visit_generator_root_p(kratos::Generator*)::__0(kratos::Generator*)>,std::allocator<int>>
                  ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_ir_cc:114:32)_(kratos::Generator_*)>
                    *)p_Var16,
                   (allocator<int> *)
                   &current_level.
                    super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_a8);
        iVar9 = pthread_mutex_lock((pthread_mutex_t *)&pool.field_0x80);
        p_Var3 = local_40;
        if (iVar9 != 0) {
          std::__throw_system_error(iVar9);
        }
        if ((char)graph.root_ == '\x01') {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          current_level.
          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &current_level.
                      super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "push called while pool is shutting down","");
          std::runtime_error::runtime_error
                    (this_00,(string *)
                             &current_level.
                              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          *(undefined ***)this_00 = &PTR__runtime_error_002ae0b8;
          __cxa_throw(this_00,&cxxpool::thread_pool_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_40->_M_use_count = local_40->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_40->_M_use_count = local_40->_M_use_count + 1;
        }
        current_level.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var16;
        __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::
                   operator++((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                              &pool.tasks_.field_0x18);
        ppVar5 = pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ptVar4 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (pool.tasks_.c.
            super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            pool.tasks_.c.
            super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((long)pool.tasks_.c.
                    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == 0x7fffffffffffffc0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar10 = (long)pool.tasks_.c.
                         super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage >> 6;
          uVar13 = uVar10 + (uVar10 == 0);
          __n = uVar13 + uVar10;
          if (0x1fffffffffffffe < __n) {
            __n = 0x1ffffffffffffff;
          }
          if (CARRY8(uVar13,uVar10)) {
            __n = 0x1ffffffffffffff;
          }
          if (__n == 0) {
            ppVar11 = (priority_task *)0x0;
          }
          else {
            ppVar11 = __gnu_cxx::new_allocator<cxxpool::detail::priority_task>::allocate
                                ((new_allocator<cxxpool::detail::priority_task> *)
                                 &pool.threads_.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,__n,(void *)0x0)
            ;
          }
          std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
          construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                    ((allocator_type *)(ppVar11 + ((long)ppVar5 - (long)ptVar4 >> 6)),
                     (priority_task *)
                     &current_level.
                      super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (anon_class_16_1_80eb7a8b *)
                     &tasks.
                      super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(unsigned_long *)__args_1,
                     in_R8);
          pptVar1 = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar12 = std::
                    vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ::_S_do_relocate(ptVar4,ppVar5,ppVar11,pptVar1);
          ppVar12 = std::
                    vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                    ::_S_do_relocate(ppVar5,ppVar5,ppVar12 + 1,pptVar1);
          if (ptVar4 != (pointer)0x0) {
            operator_delete(ptVar4,(long)pool.tasks_.c.
                                         super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar4);
          }
          pool.tasks_.c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar11 + __n;
          pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)ppVar11;
          pool.tasks_.c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar12;
        }
        else {
          std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
          construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                    ((allocator_type *)
                     pool.tasks_.c.
                     super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (priority_task *)
                     &current_level.
                      super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (anon_class_16_1_80eb7a8b *)
                     &tasks.
                      super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(unsigned_long *)__args_1,
                     in_R8);
          pool.tasks_.c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               pool.tasks_.c.
               super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::
        push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
                  (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                   pool.tasks_.c.
                   super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
        std::condition_variable::notify_one();
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)
                   &t.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(future<void> *)local_a8);
        if (t.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     t.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      for (; p_Var16 != p_Var3; p_Var16 = p_Var16 + 1) {
        std::future<void>::get((future<void> *)p_Var16);
      }
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                 &t.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78,
                        (long)current_level.
                              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_78);
      }
      bVar2 = 0 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar2);
  }
  cxxpool::thread_pool::~thread_pool((thread_pool *)&graph.root_);
  std::
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  ::~vector((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
             *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_200);
  return;
}

Assistant:

void IRVisitor::visit_generator_root_p(kratos::Generator *generator) {
    GeneratorGraph graph(generator);
    auto levels = graph.get_leveled_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    for (int i = static_cast<int>(levels.size() - 1); i >= 0; i--) {
        level = static_cast<uint32_t>(i);
        pool.clear();
        auto current_level = levels[i];
        std::vector<std::future<void>> tasks;
        tasks.reserve(current_level.size());
        for (auto *mod : current_level) {
            auto t = pool.push([=](Generator *g) { g->accept_generator(this); }, mod);
            tasks.emplace_back(std::move(t));
        }
        for (auto &t : tasks) {
            t.get();
        }
    }
}